

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

_Bool trans_MSR_imm(DisasContext_conflict1 *s,arg_MSR_imm *a)

{
  uint32_t val_00;
  uint32_t mask_00;
  int iVar1;
  uint32_t mask;
  uint32_t val;
  arg_MSR_imm *a_local;
  DisasContext_conflict1 *s_local;
  
  val_00 = ror32(a->imm,a->rot << 1);
  mask_00 = msr_mask(s,a->mask,a->r);
  iVar1 = gen_set_psr_im(s,mask_00,a->r,val_00);
  if (iVar1 != 0) {
    unallocated_encoding_aarch64(s);
  }
  return true;
}

Assistant:

static bool trans_MSR_imm(DisasContext *s, arg_MSR_imm *a)
{
    uint32_t val = ror32(a->imm, a->rot * 2);
    uint32_t mask = msr_mask(s, a->mask, a->r);

    if (gen_set_psr_im(s, mask, a->r, val)) {
        unallocated_encoding(s);
    }
    return true;
}